

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeMRRC2(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t RegNo;
  uint32_t RegNo_00;
  DecodeStatus DVar5;
  uint Rt2;
  uint Rt;
  uint cop;
  uint opc1;
  uint CRm;
  DecodeStatus S;
  void *Decoder_local;
  uint64_t Address_local;
  MCInst *pMStack_18;
  uint Val_local;
  MCInst *Inst_local;
  
  opc1 = 3;
  _CRm = Decoder;
  Decoder_local = (void *)Address;
  Address_local._4_4_ = Val;
  pMStack_18 = Inst;
  uVar2 = fieldFromInstruction_4(Val,0,4);
  uVar3 = fieldFromInstruction_4(Address_local._4_4_,4,4);
  uVar4 = fieldFromInstruction_4(Address_local._4_4_,8,4);
  RegNo = fieldFromInstruction_4(Address_local._4_4_,0xc,4);
  RegNo_00 = fieldFromInstruction_4(Address_local._4_4_,0x10,4);
  if ((uVar4 & 0xfffffffe) == 10) {
    Inst_local._4_4_ = MCDisassembler_Fail;
  }
  else {
    if (RegNo == RegNo_00) {
      opc1 = 1;
    }
    MCOperand_CreateImm0(pMStack_18,(ulong)uVar4);
    MCOperand_CreateImm0(pMStack_18,(ulong)uVar3);
    DVar5 = DecodeGPRnopcRegisterClass(pMStack_18,RegNo,(uint64_t)Decoder_local,_CRm);
    _Var1 = Check(&opc1,DVar5);
    if (_Var1) {
      DVar5 = DecodeGPRnopcRegisterClass(pMStack_18,RegNo_00,(uint64_t)Decoder_local,_CRm);
      _Var1 = Check(&opc1,DVar5);
      if (_Var1) {
        MCOperand_CreateImm0(pMStack_18,(ulong)uVar2);
        Inst_local._4_4_ = opc1;
      }
      else {
        Inst_local._4_4_ = MCDisassembler_Fail;
      }
    }
    else {
      Inst_local._4_4_ = MCDisassembler_Fail;
    }
  }
  return Inst_local._4_4_;
}

Assistant:

static DecodeStatus DecodeMRRC2(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{

	DecodeStatus S = MCDisassembler_Success;

	unsigned CRm = fieldFromInstruction_4(Val, 0, 4);
	unsigned opc1 = fieldFromInstruction_4(Val, 4, 4);
	unsigned cop = fieldFromInstruction_4(Val, 8, 4);
	unsigned Rt = fieldFromInstruction_4(Val, 12, 4);
	unsigned Rt2 = fieldFromInstruction_4(Val, 16, 4);

	if ((cop & ~0x1) == 0xa)
		return MCDisassembler_Fail;

	if (Rt == Rt2)
		S = MCDisassembler_SoftFail;

	MCOperand_CreateImm0(Inst, cop);
	MCOperand_CreateImm0(Inst, opc1);
	if (!Check(&S, DecodeGPRnopcRegisterClass(Inst, Rt, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeGPRnopcRegisterClass(Inst, Rt2, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, CRm);

	return S;
}